

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector y,N_Vector w,realtype tol,int callSetup,
              void *mem)

{
  long *plVar1;
  double dVar2;
  uint uVar3;
  N_Vector z;
  N_Vector x;
  N_Vector z_00;
  undefined4 *__s;
  double *pdVar4;
  N_Vector p_Var5;
  N_Vector y_00;
  long lVar6;
  N_Vector *Y;
  realtype *c;
  N_Vector *X;
  realtype *dotprods;
  N_Vector z_01;
  bool bVar7;
  undefined1 auVar8 [16];
  int iVar9;
  uint uVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  realtype rVar25;
  undefined1 auVar26 [16];
  double b;
  undefined1 auVar27 [16];
  double dVar28;
  realtype c_00;
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  int iVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  double a;
  int local_e0;
  
  auVar26._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar26._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar26._8_4_ = -(uint)(y == (N_Vector)0x0);
  auVar26._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar12 = movmskps((int)w,auVar26);
  iVar9 = -1;
  if (iVar12 == 0 && mem != (void *)0x0) {
    pvVar15 = NLS->content;
    z = *(N_Vector *)((long)pvVar15 + 0x58);
    x = *(N_Vector *)((long)pvVar15 + 0x60);
    z_00 = *(N_Vector *)((long)pvVar15 + 0x78);
    N_VScale(1.0,y0,y);
    pvVar15 = NLS->content;
    *(undefined4 *)((long)pvVar15 + 0x80) = 0;
    if (0 < *(int *)((long)pvVar15 + 0x84)) {
      do {
        N_VScale(1.0,y,z);
        iVar9 = (**NLS->content)(y,x,mem);
        pvVar15 = NLS->content;
        if (iVar9 != 0) break;
        uVar3 = *(uint *)((long)pvVar15 + 0x10);
        uVar20 = (ulong)uVar3;
        if (uVar20 == 0) {
          N_VScale(1.0,x,y);
        }
        else {
          uVar23 = *(uint *)((long)pvVar15 + 0x80);
          __s = *(undefined4 **)((long)pvVar15 + 0x18);
          pdVar4 = *(double **)((long)pvVar15 + 0x20);
          p_Var5 = *(N_Vector *)((long)pvVar15 + 0x70);
          y_00 = *(N_Vector *)((long)pvVar15 + 0x68);
          lVar14 = *(long *)((long)pvVar15 + 0x38);
          lVar6 = *(long *)((long)pvVar15 + 0x40);
          Y = *(N_Vector **)((long)pvVar15 + 0x48);
          c = *(realtype **)((long)pvVar15 + 0x30);
          X = *(N_Vector **)((long)pvVar15 + 0x50);
          dotprods = *(realtype **)((long)pvVar15 + 0x28);
          z_01 = *(N_Vector *)((long)pvVar15 + 0x78);
          if (0 < (int)uVar3) {
            memset(__s,0,uVar20 * 4);
          }
          uVar10 = uVar23 - 1;
          uVar16 = (long)(int)uVar10 % (long)(int)uVar3 & 0xffffffff;
          N_VLinearSum(1.0,x,-1.0,z,z_01);
          local_e0 = (int)((long)(int)uVar10 % (long)(int)uVar3);
          if (0 < (int)uVar23) {
            N_VLinearSum(1.0,x,-1.0,p_Var5,*(N_Vector *)(lVar6 + (long)local_e0 * 8));
            N_VLinearSum(1.0,z_01,-1.0,y_00,*(N_Vector *)(lVar14 + (long)local_e0 * 8));
          }
          N_VScale(1.0,x,p_Var5);
          N_VScale(1.0,z_01,y_00);
          if (uVar23 == 1) {
            p_Var5 = *(N_Vector *)(lVar14 + uVar16 * 8);
            rVar25 = N_VDotProd(p_Var5,p_Var5);
            dVar28 = 0.0;
            if (0.0 < rVar25) {
              p_Var5 = *(N_Vector *)(lVar14 + uVar16 * 8);
              rVar25 = N_VDotProd(p_Var5,p_Var5);
              if (rVar25 < 0.0) {
                dVar28 = sqrt(rVar25);
              }
              else {
                dVar28 = SQRT(rVar25);
              }
            }
            *pdVar4 = dVar28;
            N_VScale(1.0 / dVar28,*(N_Vector *)(lVar14 + uVar16 * 8),Y[uVar16]);
            *__s = 0;
          }
          else {
            if (uVar23 == 0) {
              N_VScale(1.0,x,y);
              goto LAB_00103070;
            }
            if ((int)uVar3 < (int)uVar23) {
              uVar10 = uVar3 - 1;
              if ((int)uVar3 < 2) {
                N_VScale(1.0,*(N_Vector *)(lVar14 + (long)local_e0 * 8),y);
              }
              else {
                uVar17 = (ulong)uVar10;
                pdVar18 = pdVar4 + uVar20 * 2;
                uVar22 = 2;
                uVar16 = 0;
                do {
                  auVar8 = _DAT_00105020;
                  uVar21 = uVar16 + 1;
                  uVar13 = (ulong)(uVar3 * (int)uVar21);
                  auVar26 = *(undefined1 (*) [16])(pdVar4 + uVar16 + uVar13);
                  dVar28 = auVar26._0_8_ * auVar26._0_8_ + auVar26._8_8_ * auVar26._8_8_;
                  auVar29._0_8_ = (double)(-(ulong)(0.0 < dVar28) & (ulong)SQRT(dVar28));
                  pdVar4[uVar16 + uVar13] = auVar29._0_8_;
                  auVar29._8_8_ = auVar29._0_8_;
                  auVar26 = divpd(auVar26,auVar29);
                  pdVar4[uVar16 + uVar13 + 1] = 0.0;
                  dVar28 = auVar26._0_8_;
                  b = auVar26._8_8_;
                  a = (double)((ulong)b ^ auVar8._0_8_);
                  pdVar11 = pdVar18;
                  uVar13 = uVar20;
                  if (uVar16 + 2 < uVar20) {
                    do {
                      dVar2 = *pdVar11;
                      *pdVar11 = dVar2 * dVar28 + pdVar11[1] * b;
                      pdVar11[1] = dVar2 * a + pdVar11[1] * dVar28;
                      uVar13 = uVar13 - 1;
                      pdVar11 = pdVar11 + uVar20;
                    } while (uVar22 != uVar13);
                  }
                  N_VLinearSum(dVar28,Y[uVar16],b,Y[uVar21],y);
                  N_VLinearSum(a,Y[uVar16],dVar28,Y[uVar21],Y[uVar21]);
                  N_VScale(1.0,y,Y[uVar16]);
                  uVar22 = uVar22 + 1;
                  pdVar18 = pdVar18 + uVar20 + 1;
                  uVar16 = uVar21;
                } while (uVar21 != uVar17);
                uVar22 = 1;
                pdVar18 = pdVar4;
                uVar16 = uVar17;
                pdVar11 = pdVar4;
                do {
                  do {
                    *pdVar18 = pdVar18[uVar20];
                    uVar16 = uVar16 - 1;
                    pdVar18 = pdVar18 + 1;
                  } while (uVar16 != 0);
                  uVar22 = uVar22 + 1;
                  pdVar18 = pdVar11 + uVar20;
                  uVar16 = uVar17;
                  pdVar11 = pdVar18;
                } while (uVar22 != uVar20);
                N_VScale(1.0,*(N_Vector *)(lVar14 + (long)local_e0 * 8),y);
                uVar16 = 0;
                do {
                  rVar25 = N_VDotProd(Y[uVar16],y);
                  pdVar4[uVar10 * uVar3 + uVar16] = rVar25;
                  N_VLinearSum(1.0,y,-rVar25,Y[uVar16],y);
                  uVar16 = uVar16 + 1;
                } while (uVar17 != uVar16);
              }
              rVar25 = N_VDotProd(y,y);
              dVar28 = 0.0;
              if (0.0 < rVar25) {
                rVar25 = N_VDotProd(y,y);
                if (rVar25 < 0.0) {
                  dVar28 = sqrt(rVar25);
                }
                else {
                  dVar28 = SQRT(rVar25);
                }
              }
              pdVar4[(long)(int)(uVar3 * uVar3) + -1] = dVar28;
              N_VScale(1.0 / dVar28,y,Y[(int)uVar10]);
              auVar29 = _DAT_00105050;
              auVar8 = _DAT_00105040;
              auVar26 = _DAT_00105030;
              if ((int)(local_e0 + 1U) < (int)uVar3) {
                uVar16 = (ulong)(uVar10 - local_e0);
                lVar14 = uVar16 - 1;
                auVar27._8_4_ = (int)lVar14;
                auVar27._0_8_ = lVar14;
                auVar27._12_4_ = (int)((ulong)lVar14 >> 0x20);
                uVar17 = 0;
                auVar33 = _DAT_00105040;
                auVar30 = _DAT_00105030;
                do {
                  auVar32 = auVar27 ^ auVar29;
                  auVar35 = auVar33 ^ auVar29;
                  iVar12 = auVar32._4_4_;
                  iVar9 = (int)uVar17;
                  if ((bool)(~(iVar12 < auVar35._4_4_ ||
                              auVar32._0_4_ < auVar35._0_4_ && auVar35._4_4_ == iVar12) & 1)) {
                    __s[uVar17] = local_e0 + iVar9 + 1;
                  }
                  if (auVar35._12_4_ <= auVar32._12_4_ &&
                      (auVar35._8_4_ <= auVar32._8_4_ || auVar35._12_4_ != auVar32._12_4_)) {
                    __s[uVar17 + 1] = local_e0 + iVar9 + 2;
                  }
                  iVar31 = SUB164(auVar30 ^ auVar29,4);
                  if (iVar31 <= iVar12 &&
                      (iVar31 != iVar12 || SUB164(auVar30 ^ auVar29,0) <= auVar32._0_4_)) {
                    __s[uVar17 + 2] = local_e0 + iVar9 + 3;
                    __s[uVar17 + 3] = local_e0 + iVar9 + 4;
                  }
                  uVar17 = uVar17 + 4;
                  lVar14 = auVar33._8_8_;
                  auVar33._0_8_ = auVar33._0_8_ + 4;
                  auVar33._8_8_ = lVar14 + 4;
                  lVar14 = auVar30._8_8_;
                  auVar30._0_8_ = auVar30._0_8_ + 4;
                  auVar30._8_8_ = lVar14 + 4;
                } while ((uVar16 + 3 & 0xfffffffffffffffc) != uVar17);
              }
              else {
                uVar16 = 0;
              }
              if (-1 < local_e0) {
                lVar14 = (ulong)(local_e0 + 1U) - 1;
                auVar32._8_4_ = (int)lVar14;
                auVar32._0_8_ = lVar14;
                auVar32._12_4_ = (int)((ulong)lVar14 >> 0x20);
                uVar17 = 0;
                do {
                  iVar9 = (int)uVar17;
                  auVar35._8_4_ = iVar9;
                  auVar35._0_8_ = uVar17;
                  auVar35._12_4_ = (int)(uVar17 >> 0x20);
                  auVar33 = (auVar35 | auVar8) ^ auVar29;
                  iVar12 = SUB164(auVar32 ^ auVar29,0);
                  bVar7 = iVar12 < auVar33._0_4_;
                  iVar31 = SUB164(auVar32 ^ auVar29,4);
                  iVar34 = auVar33._4_4_;
                  if ((bool)(~(iVar31 < iVar34 || iVar34 == iVar31 && bVar7) & 1)) {
                    __s[uVar16 + uVar17] = iVar9;
                  }
                  if (iVar31 >= iVar34 && (iVar34 != iVar31 || !bVar7)) {
                    __s[uVar16 + uVar17 + 1] = iVar9 + 1;
                  }
                  auVar33 = (auVar35 | auVar26) ^ auVar29;
                  iVar34 = auVar33._4_4_;
                  if (iVar34 <= iVar31 && (iVar34 != iVar31 || auVar33._0_4_ <= iVar12)) {
                    __s[uVar16 + uVar17 + 2] = iVar9 + 2;
                    __s[uVar16 + uVar17 + 3] = iVar9 + 3;
                  }
                  uVar17 = uVar17 + 4;
                } while ((local_e0 + 4U & 0xfffffffc) != uVar17);
              }
            }
            else {
              N_VScale(1.0,*(N_Vector *)(lVar14 + (long)local_e0 * 8),y);
              if (1 < (int)uVar23) {
                uVar16 = 0;
                do {
                  __s[uVar16] = (int)uVar16;
                  rVar25 = N_VDotProd(Y[uVar16],y);
                  pdVar4[(long)(int)(uVar10 * uVar3) + uVar16] = rVar25;
                  N_VLinearSum(1.0,y,-rVar25,Y[uVar16],y);
                  uVar16 = uVar16 + 1;
                } while (uVar10 != uVar16);
              }
              rVar25 = N_VDotProd(y,y);
              c_00 = 0.0;
              if (rVar25 <= 0.0) {
                pdVar4[(long)(int)(uVar3 * uVar10 + uVar23) + -1] = 0.0;
              }
              else {
                rVar25 = N_VDotProd(y,y);
                if (rVar25 < 0.0) {
                  dVar28 = sqrt(rVar25);
                }
                else {
                  dVar28 = SQRT(rVar25);
                }
                pdVar4[(long)(int)(uVar10 * uVar3 + uVar23) + -1] = dVar28;
                c_00 = 0.0;
                if ((dVar28 != 0.0) || (NAN(dVar28))) {
                  c_00 = 1.0 / dVar28;
                }
              }
              N_VScale(c_00,y,Y[local_e0]);
              __s[(int)uVar10] = uVar10;
            }
          }
          uVar16 = (ulong)uVar23;
          if ((int)uVar3 < (int)uVar23) {
            uVar16 = uVar20;
          }
          iVar12 = (int)uVar16;
          iVar9 = N_VDotProdMulti(iVar12,z_01,Y,dotprods);
          if (iVar9 == 0) {
            *c = 1.0;
            *X = x;
            if (iVar12 < 1) {
              uVar23 = 1;
            }
            else {
              lVar14 = (long)(int)uVar3;
              uVar23 = iVar12 + 1;
              pdVar18 = (double *)((long)pdVar4 + (lVar14 * 8 + 8) * uVar16 + -8);
              uVar17 = 1;
              lVar19 = 0;
              uVar22 = (ulong)DAT_00105020;
              uVar20 = uVar16;
              do {
                rVar25 = dotprods[uVar20 - 1];
                uVar21 = uVar20 - 1;
                pdVar11 = pdVar18;
                lVar24 = lVar19;
                if ((long)uVar20 < (long)uVar16) {
                  do {
                    rVar25 = rVar25 - *pdVar11 * dotprods[uVar16 + lVar24];
                    dotprods[uVar21] = rVar25;
                    lVar24 = lVar24 + 1;
                    pdVar11 = pdVar11 + lVar14;
                  } while ((int)lVar24 != 0);
                }
                dVar28 = 0.0;
                if ((rVar25 != 0.0) || (NAN(rVar25))) {
                  dVar28 = rVar25 / pdVar4[(int)((uVar3 + 1) * (int)uVar21)];
                }
                dotprods[uVar21] = dVar28;
                c[uVar17] = (realtype)((ulong)dVar28 ^ uVar22);
                X[uVar17] = *(N_Vector *)(lVar6 + (long)(int)__s[uVar21] * 8);
                uVar17 = uVar17 + 1;
                lVar19 = lVar19 + -1;
                pdVar18 = (double *)((long)pdVar18 + (lVar14 * 8 ^ 0xfffffffffffffff8U));
                uVar20 = uVar21;
              } while (uVar17 != uVar23);
            }
            N_VLinearCombination(uVar23,c,X,y);
          }
        }
LAB_00103070:
        plVar1 = (long *)((long)NLS->content + 0x88);
        *plVar1 = *plVar1 + 1;
        N_VLinearSum(1.0,y,-1.0,z,z_00);
        iVar9 = (**(code **)((long)NLS->content + 8))(tol,NLS,y,z_00,w,mem);
        if (iVar9 != 1) {
          if (iVar9 == 0) {
            return 0;
          }
          pvVar15 = NLS->content;
          goto LAB_001030ef;
        }
        pvVar15 = NLS->content;
        iVar9 = *(int *)((long)pvVar15 + 0x80) + 1;
        *(int *)((long)pvVar15 + 0x80) = iVar9;
      } while (iVar9 < *(int *)((long)pvVar15 + 0x84));
    }
    iVar9 = 2;
LAB_001030ef:
    *(long *)((long)pvVar15 + 0x90) = *(long *)((long)pvVar15 + 0x90) + 1;
  }
  return iVar9;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector y, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS == NULL) || (y0 == NULL) || (y == NULL) || (w == NULL) || (mem == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* load prediction into y */
  N_VScale(ONE, y0, y);

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, y, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(y, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, y);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, y, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, y, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, y, delta, tol, w, mem);

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}